

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

gss_name_t qGSsapiGetServiceName(QStringView host)

{
  OM_uint32 stat;
  OM_uint32 stat_00;
  QArrayData *pQVar1;
  long in_FS_OFFSET;
  QStringView QVar2;
  OM_uint32 minStat;
  gss_name_t importedName;
  OM_uint32 local_8c;
  QArrayData *local_88;
  char *pcStack_80;
  qsizetype local_78;
  QStringBuilder<const_char_(&)[7],_QByteArray> local_68;
  QByteArray local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QVar2.m_data = (storage_type_conflict *)host.m_size;
  QVar2.m_size = (qsizetype)&local_88;
  QtPrivate::convertToLocal8Bit(QVar2);
  local_68.b.d.size = local_78;
  local_68.b.d.ptr = pcStack_80;
  local_68.b.d.d = (Data *)local_88;
  local_68.a = (char (*) [7])0x25dbe4;
  local_88 = (QArrayData *)0x0;
  pcStack_80 = (char *)0x0;
  local_78 = 0;
  QStringBuilder<const_char_(&)[7],_QByteArray>::convertTo<QByteArray>(&local_48,&local_68);
  if (&(local_68.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.b.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,1,0x10);
    }
  }
  local_68.b.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.a = (char (*) [7])local_48.d.size;
  if ((&(local_48.d.d)->super_QArrayData == (QArrayData *)0x0) ||
     (1 < ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData((longlong)&local_48,(AllocationOption)local_48.d.size);
  }
  local_68.b.d.d = (Data *)local_48.d.ptr;
  local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  local_8c = 0xaaaaaaaa;
  stat_00 = gss_import_name(&local_8c,&local_68,_GSS_C_NT_HOSTBASED_SERVICE);
  stat = local_8c;
  pQVar1 = local_88;
  if (stat_00 != 0) {
    q_GSSAPI_error_int("gss_import_name error",stat_00,1);
    q_GSSAPI_error_int("gss_import_name error",stat,2);
    pQVar1 = (QArrayData *)0x0;
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return (gss_name_t)pQVar1;
}

Assistant:

static gss_name_t qGSsapiGetServiceName(QStringView host)
{
    QByteArray serviceName = "HTTPS@" + host.toLocal8Bit();
    gss_buffer_desc nameDesc = {static_cast<std::size_t>(serviceName.size()), serviceName.data()};

    gss_name_t importedName;
    OM_uint32 minStat;
    OM_uint32 majStat = gss_import_name(&minStat, &nameDesc,
                              GSS_C_NT_HOSTBASED_SERVICE, &importedName);

    if (majStat != GSS_S_COMPLETE) {
        q_GSSAPI_error("gss_import_name error", majStat, minStat);
        return nullptr;
    }
    return importedName;
}